

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall
flatbuffers::ToStringVisitor::Element
          (ToStringVisitor *this,size_t i,ElementaryType param_2,TypeTable *param_3,uint8_t *param_4
          )

{
  uint8_t *param_4_local;
  TypeTable *param_3_local;
  ElementaryType param_2_local;
  size_t i_local;
  ToStringVisitor *this_local;
  
  if (i != 0) {
    std::__cxx11::string::operator+=((string *)&this->s,",");
    if ((this->vector_delimited & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)&this->s," ");
    }
    else {
      std::__cxx11::string::operator+=((string *)&this->s,(string *)&this->d);
      append_indent(this);
    }
  }
  return;
}

Assistant:

void Element(size_t i, ElementaryType /*type*/,
               const TypeTable * /*type_table*/, const uint8_t * /*val*/) {
    if (i) {
      s += ",";
      if (vector_delimited) {
        s += d;
        append_indent();
      } else {
        s += " ";
      }
    }
  }